

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O0

void __thiscall poly::poly(poly *this,size_t bits,istream *ss)

{
  void *this_00;
  reference pvVar1;
  ulong local_38;
  size_t i;
  istream *ss_local;
  size_t bits_local;
  poly *this_local;
  
  std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->x);
  std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->x,bits >> 5);
  for (local_38 = 0; local_38 < bits >> 5; local_38 = local_38 + 1) {
    this_00 = (void *)std::istream::operator>>(ss,std::hex);
    pvVar1 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->x,local_38);
    std::istream::operator>>(this_00,pvVar1);
  }
  this->_degree = -1;
  return;
}

Assistant:

poly::poly(size_t bits, std::istream &ss) {
    x.resize(bits / 32);
    for (size_t i = 0; i < bits / 32; i++)
        ss >> std::hex >> x[i];
    _degree = -1;
}